

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

intptr_t ArrayAddEx(array *p,size_t Count,size_t Width,void *Data,arraycmp Cmp,void *CmpParam,
                   size_t Align)

{
  intptr_t iVar1;
  bool_t bVar2;
  long local_30;
  
  iVar1 = ArrayFindEx(p,Count,Width,Data,Cmp,CmpParam,&local_30);
  if (local_30 == 0) {
    bVar2 = ArrayInsert(p,iVar1 * Width,Data,Width,Align);
    if (bVar2 == 0) {
      iVar1 = -1;
    }
  }
  else {
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x204,
                    "intptr_t ArrayAddEx(array *, size_t, size_t, const void *, arraycmp, const void *, size_t)"
                   );
    }
    memcpy(p->_Begin + iVar1 * Width,Data,Width);
  }
  return iVar1;
}

Assistant:

intptr_t ArrayAddEx(array* p,size_t Count, size_t Width, const void* Data, arraycmp Cmp, const void* CmpParam, size_t Align)
{
    intptr_t Pos;
    bool_t Found;

    Pos = ArrayFindEx(p,Count,Width,Data,Cmp,CmpParam,&Found);
    if (!Found)
    {
        if (!ArrayInsert(p,Width*Pos,Data,Width,Align))
            return -1;
    }
    else
        memcpy(ARRAYBEGIN(*p,uint8_t) + Width*Pos, Data, Width);

    return Pos;
}